

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.hh
# Opt level: O2

void __thiscall MemoryImage::insert(MemoryImage *this,uintb addr,uintb val)

{
  LowlevelError *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_38,"Writing to read-only MemoryBank",&local_39);
  LowlevelError::LowlevelError(this_00,&local_38);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

virtual void insert(uintb addr,uintb val) {
    throw LowlevelError("Writing to read-only MemoryBank"); }